

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  byte in_CL;
  undefined1 in_DL;
  long *in_RDI;
  Extension *extension;
  size_t n;
  Arena **in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  type_info *in_stack_fffffffffffffe08;
  Arena *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  ArenaImpl *in_stack_fffffffffffffe20;
  Extension **in_stack_fffffffffffffe28;
  FieldDescriptor *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  ExtensionSet *in_stack_fffffffffffffe40;
  undefined8 *local_90;
  RepeatedField<int> *local_38;
  
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                            in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (bVar1) {
    *(undefined1 *)(local_90 + 1) = in_DL;
    *(undefined1 *)((long)local_90 + 9) = 1;
    *(byte *)((long)local_90 + 0xb) = in_CL & 1;
    if (*in_RDI == 0) {
      local_38 = (RepeatedField<int> *)operator_new(0x10);
      RepeatedField<int>::RepeatedField(local_38);
    }
    else {
      AlignUpTo8(0x10);
      Arena::AllocHook(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00);
      ArenaImpl::AllocateAlignedAndAddCleanup
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (_func_void_void_ptr *)in_stack_fffffffffffffe10);
      local_38 = Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                 Construct<google::protobuf::Arena*>
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    *local_90 = local_38;
  }
  RepeatedField<int>::Add
            ((RepeatedField<int> *)in_stack_fffffffffffffe10,(int *)in_stack_fffffffffffffe08);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}